

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O0

int booster::locale::utf::utf_traits<char,_1>::width(code_point value)

{
  code_point value_local;
  undefined4 local_4;
  
  if (value < 0x80) {
    local_4 = 1;
  }
  else if (value < 0x800) {
    local_4 = 2;
  }
  else if (value < 0x10000) {
    local_4 = 3;
  }
  else {
    local_4 = 4;
  }
  return local_4;
}

Assistant:

static int width(code_point value)
        {
            if(value <=0x7F) {
                return 1;
            }
            else if(value <=0x7FF) {
                return 2;
            }
            else if(BOOSTER_LOCALE_LIKELY(value <=0xFFFF)) {
                return 3;
            }
            else {
                return 4;
            }
        }